

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O0

Vec_Ptr_t *
Abc_NtkDressComputeEquivs(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nConflictLimit,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Aig_Man_t *p1;
  Aig_Man_t *p2;
  Aig_Man_t *pAig;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *vRes;
  Aig_Man_t *pMiter;
  Aig_Man_t *pMan2;
  Aig_Man_t *pMan1;
  Abc_Ntk_t *pAig2;
  Abc_Ntk_t *pAig1;
  Dch_Pars_t *pPars;
  Dch_Pars_t Pars;
  int fVerbose_local;
  int nConflictLimit_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  Pars.nNodesAhead = fVerbose;
  Pars.nCallsRecycle = nConflictLimit;
  iVar1 = Abc_NtkIsStrash(pNtk1);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NtkIsStrash(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress2.c"
                  ,0x128,"Vec_Ptr_t *Abc_NtkDressComputeEquivs(Abc_Ntk_t *, Abc_Ntk_t *, int, int)")
    ;
  }
  iVar1 = Abc_NtkIsStrash(pNtk2);
  if (iVar1 == 0) {
    pNtk = Abc_NtkStrash(pNtk1,1,1,0);
    pNtk_00 = Abc_NtkStrash(pNtk2,1,1,0);
    p1 = Abc_NtkToDar(pNtk,0,0);
    p2 = Abc_NtkToDar(pNtk_00,0,0);
    pAig = Aig_ManCreateDualOutputMiter(p1,p2);
    Dch_ManSetDefaultParams((Dch_Pars_t *)&pPars);
    pPars._4_4_ = Pars.nCallsRecycle;
    Pars.fLightSynth = Pars.nNodesAhead;
    Dch_ComputeEquivalences(pAig,(Dch_Pars_t *)&pPars);
    pVVar2 = Abc_NtkDressMapIds(pAig,pNtk1,pNtk2);
    Aig_ManStop(pAig);
    Aig_ManStop(p1);
    Aig_ManStop(p2);
    Abc_NtkDelete(pNtk);
    Abc_NtkDelete(pNtk_00);
    return pVVar2;
  }
  __assert_fail("!Abc_NtkIsStrash(pNtk2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress2.c"
                ,0x129,"Vec_Ptr_t *Abc_NtkDressComputeEquivs(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDressComputeEquivs( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConflictLimit, int fVerbose )
{
    Dch_Pars_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pAig1, * pAig2;
    Aig_Man_t * pMan1, * pMan2, * pMiter;
    Vec_Ptr_t * vRes;
    assert( !Abc_NtkIsStrash(pNtk1) );
    assert( !Abc_NtkIsStrash(pNtk2) );
    // convert network into AIG
    pAig1 = Abc_NtkStrash( pNtk1, 1, 1, 0 );
    pAig2 = Abc_NtkStrash( pNtk2, 1, 1, 0 );
    pMan1 = Abc_NtkToDar( pAig1, 0, 0 );
    pMan2 = Abc_NtkToDar( pAig2, 0, 0 );
    // derive the miter
    pMiter = Aig_ManCreateDualOutputMiter( pMan1, pMan2 );
    // set up parameters for SAT sweeping
    Dch_ManSetDefaultParams( pPars );
    pPars->nBTLimit = nConflictLimit;
    pPars->fVerbose = fVerbose;
    // perform SAT sweeping
    Dch_ComputeEquivalences( pMiter, pPars );
    // now, pMiter is annotated with the equivl class info
    // convert this info into the resulting array
    vRes = Abc_NtkDressMapIds( pMiter, pNtk1, pNtk2 );
    Aig_ManStop( pMiter );
    Aig_ManStop( pMan1 );
    Aig_ManStop( pMan2 );
    Abc_NtkDelete( pAig1 );
    Abc_NtkDelete( pAig2 );
    return vRes;
}